

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<long>::Clear
          (RepeatedFieldWrapper<long> *this,Field *data)

{
  RepeatedField<long>::Clear((RepeatedField<long> *)data);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }